

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BVH.cpp
# Opt level: O3

void SimpleBVH::point_segment_squared_distance
               (VectorMax3d *point,array<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_2UL> *f,
               VectorMax3d *closest_point,double *dist)

{
  plainobjectbase_evaluator_data<double,_0> pVar1;
  double *pdVar2;
  double *pdVar3;
  double dVar4;
  double dVar5;
  Index size;
  ulong uVar6;
  ulong uVar7;
  char *pcVar8;
  ulong uVar9;
  long lVar10;
  SrcEvaluatorType srcEvaluator;
  ActualDstType actualDst;
  Scalar SVar11;
  Scalar SVar12;
  double dVar13;
  double dVar14;
  redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>_>
  local_b8;
  CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>
  local_80;
  double local_40;
  scalar_sum_op<double,_double> local_31;
  
  lVar10 = f->_M_elems[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.
           m_rows;
  if (lVar10 == f->_M_elems[1].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                m_storage.m_rows) {
    pVar1.data = (double *)(f->_M_elems + 1);
    local_80.m_lhs.m_lhs = f->_M_elems;
    local_80.m_lhs.m_rhs = (RhsNested)pVar1.data;
    if (lVar10 != 0) {
      if (0 < lVar10) {
        local_b8.
        super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>_>
        .
        super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
        .m_d.lhsImpl.
        super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>
        .
        super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
        .m_d.lhsImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
        super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>.m_d.data =
             (evaluator<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>)
             (evaluator<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>)f;
        local_b8.
        super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>_>
        .
        super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
        .m_d.lhsImpl.
        super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>
        .
        super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
        .m_d.rhsImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
        super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>.m_d.data =
             (evaluator<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>)
             (evaluator<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>)pVar1.data;
        SVar11 = Eigen::internal::
                 redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,-1,1,0,3,1>const,Eigen::Matrix<double,-1,1,0,3,1>const>const>>,3,0>
                 ::
                 run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,3,1>const,Eigen::Matrix<double,_1,1,0,3,1>const>const>>
                           ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>_>
                             *)&local_b8,&local_31,
                            (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>
                             *)&local_80);
        lVar10 = f->_M_elems[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                 m_storage.m_rows;
        goto LAB_00115d8e;
      }
LAB_001160b5:
      pcVar8 = 
      "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>>>>::redux(const Func &) const [Derived = Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>>>, BinaryOp = Eigen::internal::scalar_sum_op<double>]"
      ;
LAB_001160e1:
      __assert_fail("this->rows()>0 && this->cols()>0 && \"you are using an empty matrix\"",
                    "/root/.cache/CPM/eigen/9cb760a6fcc3143cbb7856ce4548b1cf4b385f2e/Eigen/src/Core/Redux.h"
                    ,0x19b,pcVar8);
    }
    SVar11 = 0.0;
    lVar10 = 0;
LAB_00115d8e:
    if (((point->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage.m_rows ==
         lVar10) &&
       (f->_M_elems[1].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.
        m_rows == lVar10)) {
      local_80.m_lhs.m_lhs = point;
      local_80.m_lhs.m_rhs = f->_M_elems;
      local_80.m_rhs.m_lhs = (LhsNested)pVar1.data;
      local_80.m_rhs.m_rhs = f->_M_elems;
      if (lVar10 == 0) {
        uVar6 = 0;
        if ((closest_point->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage
            .m_rows != 0) {
LAB_00115ec3:
          (closest_point->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage.
          m_rows = uVar6;
        }
LAB_00115eca:
        uVar9 = (ulong)((uint)((ulong)closest_point >> 3) & 1);
        if ((long)uVar6 <= (long)uVar9) {
          uVar9 = uVar6;
        }
        lVar10 = uVar6 - uVar9;
        if (0 < (long)uVar9) {
          (closest_point->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage.
          m_data.array[0] =
               f->_M_elems[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
               m_storage.m_data.array[0];
        }
        uVar7 = (lVar10 - (lVar10 >> 0x3f) & 0xfffffffffffffffeU) + uVar9;
        if (1 < lVar10) {
          do {
            pdVar2 = f->_M_elems[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                     m_storage.m_data.array + uVar9;
            dVar13 = pdVar2[1];
            pdVar3 = (closest_point->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).
                     m_storage.m_data.array + uVar9;
            *pdVar3 = *pdVar2;
            pdVar3[1] = dVar13;
            uVar9 = uVar9 + 2;
          } while ((long)uVar9 < (long)uVar7);
        }
        if ((long)uVar7 < (long)uVar6) {
          do {
            (closest_point->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage
            .m_data.array[uVar7] =
                 f->_M_elems[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                 m_storage.m_data.array[uVar7];
            uVar7 = uVar7 + 1;
          } while (uVar6 != uVar7);
        }
      }
      else {
        local_40 = SVar11;
        if (lVar10 < 1) {
          pcVar8 = 
          "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>>>>::redux(const Func &) const [Derived = Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>>>, BinaryOp = Eigen::internal::scalar_sum_op<double>]"
          ;
          goto LAB_001160e1;
        }
        local_b8.
        super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>_>
        .
        super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
        .m_d.lhsImpl.
        super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>
        .
        super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
        .m_d.lhsImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
        super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>.m_d.data =
             (evaluator<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>)
             (evaluator<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>)point;
        local_b8.
        super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>_>
        .
        super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
        .m_d.lhsImpl.
        super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>
        .
        super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
        .m_d.rhsImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
        super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>.m_d.data =
             (evaluator<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>)
             (evaluator<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>)f;
        local_b8.
        super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>_>
        .
        super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
        .m_d.rhsImpl.
        super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>
        .
        super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
        .m_d.lhsImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
        super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>.m_d.data =
             (evaluator<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>)
             (evaluator<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>)pVar1.data;
        local_b8.
        super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>_>
        .
        super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
        .m_d.rhsImpl.
        super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>
        .
        super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
        .m_d.rhsImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
        super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>.m_d.data =
             (evaluator<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>)
             (evaluator<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>)f;
        SVar12 = Eigen::internal::
                 redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,-1,1,0,3,1>const,Eigen::Matrix<double,-1,1,0,3,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,-1,1,0,3,1>const,Eigen::Matrix<double,-1,1,0,3,1>const>const>>,3,0>
                 ::
                 run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,3,1>const,Eigen::Matrix<double,_1,1,0,3,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,3,1>const,Eigen::Matrix<double,_1,1,0,3,1>const>const>>
                           (&local_b8,&local_31,&local_80);
        if (((local_40 == 0.0) && (!NAN(local_40))) || (SVar12 <= 0.0)) {
          uVar6 = f->_M_elems[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                  m_storage.m_rows;
          if ((closest_point->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).
              m_storage.m_rows != uVar6) {
            if (3 < uVar6) {
LAB_0011610a:
              __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                            ,
                            "/root/.cache/CPM/eigen/9cb760a6fcc3143cbb7856ce4548b1cf4b385f2e/Eigen/src/Core/PlainObjectBase.h"
                            ,0x115,
                            "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1, 0, 3, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, 1, 0, 3, 1>]"
                           );
            }
            goto LAB_00115ec3;
          }
          goto LAB_00115eca;
        }
        if (SVar12 <= local_40) {
          uVar6 = f->_M_elems[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                  m_storage.m_rows;
          if (((long)uVar6 < 0) ||
             (uVar9 = f->_M_elems[1].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                      m_storage.m_rows, (long)uVar9 < 0)) {
            __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                          ,
                          "/root/.cache/CPM/eigen/9cb760a6fcc3143cbb7856ce4548b1cf4b385f2e/Eigen/src/Core/CwiseNullaryOp.h"
                          ,0x4a,
                          "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, 1, 0, 3, 1>]"
                         );
          }
          if (uVar6 != uVar9) {
            pcVar8 = 
            "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>>, Rhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>>]"
            ;
            goto LAB_001160ab;
          }
          if ((closest_point->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).
              m_storage.m_rows != uVar6) {
            if (3 < uVar6) goto LAB_0011610a;
            (closest_point->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage
            .m_rows = uVar6;
          }
          dVar13 = SVar12 / local_40;
          uVar9 = (ulong)((uint)((ulong)closest_point >> 3) & 1);
          if (uVar6 <= uVar9) {
            uVar9 = uVar6;
          }
          dVar14 = 1.0 - dVar13;
          lVar10 = uVar6 - uVar9;
          if (uVar9 != 0) {
            (closest_point->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage
            .m_data.array[0] =
                 f->_M_elems[1].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                 m_storage.m_data.array[0] * dVar13 +
                 f->_M_elems[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                 m_storage.m_data.array[0] * dVar14;
          }
          uVar7 = lVar10 - (lVar10 >> 0x3f) & 0xfffffffffffffffeU | uVar9;
          if (1 < lVar10) {
            do {
              pdVar3 = f->_M_elems[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                       m_storage.m_data.array + uVar9;
              dVar4 = pdVar3[1];
              dVar5 = (pVar1.data + uVar9)[1];
              pdVar2 = (closest_point->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>
                       ).m_storage.m_data.array + uVar9;
              *pdVar2 = pVar1.data[uVar9] * dVar13 + *pdVar3 * dVar14;
              pdVar2[1] = dVar5 * dVar13 + dVar4 * dVar14;
              uVar9 = uVar9 + 2;
            } while (uVar9 < uVar7);
          }
          if ((long)uVar7 < (long)uVar6) {
            do {
              (closest_point->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).
              m_storage.m_data.array[uVar7] =
                   pVar1.data[uVar7] * dVar13 +
                   f->_M_elems[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                   m_storage.m_data.array[uVar7] * dVar14;
              uVar7 = uVar7 + 1;
            } while (uVar6 != uVar7);
          }
        }
        else {
          uVar6 = f->_M_elems[1].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                  m_storage.m_rows;
          if ((closest_point->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).
              m_storage.m_rows != uVar6) {
            if (3 < uVar6) goto LAB_0011610a;
            (closest_point->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage
            .m_rows = uVar6;
          }
          uVar9 = (ulong)((uint)((ulong)closest_point >> 3) & 1);
          if ((long)uVar6 <= (long)uVar9) {
            uVar9 = uVar6;
          }
          lVar10 = uVar6 - uVar9;
          if (0 < (long)uVar9) {
            (closest_point->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage
            .m_data.array[0] = *pVar1.data;
          }
          uVar7 = (lVar10 - (lVar10 >> 0x3f) & 0xfffffffffffffffeU) + uVar9;
          if (1 < lVar10) {
            do {
              dVar13 = (pVar1.data + uVar9)[1];
              pdVar2 = (closest_point->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>
                       ).m_storage.m_data.array + uVar9;
              *pdVar2 = pVar1.data[uVar9];
              pdVar2[1] = dVar13;
              uVar9 = uVar9 + 2;
            } while ((long)uVar9 < (long)uVar7);
          }
          if ((long)uVar7 < (long)uVar6) {
            do {
              (closest_point->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).
              m_storage.m_data.array[uVar7] = pVar1.data[uVar7];
              uVar7 = uVar7 + 1;
            } while (uVar6 != uVar7);
          }
        }
      }
      lVar10 = (point->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage.
               m_rows;
      if (lVar10 == (closest_point->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).
                    m_storage.m_rows) {
        if (lVar10 == 0) {
          dVar13 = 0.0;
LAB_00115f78:
          *dist = dVar13;
          return;
        }
        local_80.m_lhs.m_lhs = point;
        local_80.m_lhs.m_rhs = closest_point;
        if (0 < lVar10) {
          local_b8.
          super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>_>
          .
          super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
          .m_d.lhsImpl.
          super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>
          .
          super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
          .m_d.lhsImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
          super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>.m_d.data
               = (evaluator<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>)
                 (evaluator<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>)point;
          local_b8.
          super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>_>
          .
          super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
          .m_d.lhsImpl.
          super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>
          .
          super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
          .m_d.rhsImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
          super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>.m_d.data
               = (evaluator<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>)
                 (evaluator<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>)closest_point;
          dVar13 = Eigen::internal::
                   redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,-1,1,0,3,1>const,Eigen::Matrix<double,-1,1,0,3,1>const>const>>,3,0>
                   ::
                   run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,3,1>const,Eigen::Matrix<double,_1,1,0,3,1>const>const>>
                             ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>_>
                               *)&local_b8,&local_31,
                              (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>
                               *)&local_80);
          goto LAB_00115f78;
        }
        goto LAB_001160b5;
      }
    }
  }
  pcVar8 = 
  "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Matrix<double, -1, 1, 0, 3, 1>, Rhs = const Eigen::Matrix<double, -1, 1, 0, 3, 1>]"
  ;
LAB_001160ab:
  __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                "/root/.cache/CPM/eigen/9cb760a6fcc3143cbb7856ce4548b1cf4b385f2e/Eigen/src/Core/CwiseBinaryOp.h"
                ,0x74,pcVar8);
}

Assistant:

void point_segment_squared_distance(
    const VectorMax3d& point,
    const std::array<VectorMax3d, 2>& f,
    VectorMax3d& closest_point,
    double& dist)
{
    const double l2 = (f[0] - f[1]).squaredNorm();
    const double t = (point - f[0]).dot(f[1] - f[0]);
    if (t <= 0.0 || l2 == 0.0) {
        closest_point = f[0];
    } else if (t > l2) {
        closest_point = f[1];
    } else {
        const double lambda1 = t / l2;
        const double lambda0 = 1.0 - lambda1;
        closest_point = lambda0 * f[0] + lambda1 * f[1];
    }
    dist = (point - closest_point).squaredNorm();
}